

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O3

void __thiscall mnf::Point::Point(Point *this,Point *other)

{
  Index outer_stride;
  ConstRefVec local_60;
  double *local_38;
  long local_30;
  
  ConstSubPoint::value(&local_60,&(other->super_SubPoint).super_ConstSubPoint);
  PointMemory::PointMemory(&this->super_PointMemory,&local_60);
  free(local_60.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  this->_vptr_Point = (_func_int **)&PTR_format_00141950;
  local_30 = (this->super_PointMemory).mem_.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if (0 < local_30) {
    local_38 = (this->super_PointMemory).mem_.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    SubPoint::SubPoint(&this->super_SubPoint,(other->super_SubPoint).super_ConstSubPoint.manifold_,
                       (RefVec *)&local_38);
    this->_vptr_Point = (_func_int **)&PTR_format_00141950;
    return;
  }
  __assert_fail("mem_.size() > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/src/Point.cpp"
                ,0x5c,"Eigen::VectorXd &mnf::PointMemory::getMem()");
}

Assistant:

Point::Point(const Point& other)
    : PointMemory(other.value()), SubPoint(other.getManifold(), getMem())
{
}